

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int poly(double *A,double *B,double *C,int lA,int lB)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar1 = (lA + lB) - 1;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    memset(C,0,(ulong)((lB + lA) - 2) * 8 + 8);
    do {
      dVar6 = 0.0;
      if (0 < lA) {
        uVar3 = 0;
        uVar2 = uVar5;
        do {
          if (0 < lB) {
            uVar4 = 0;
            do {
              if (uVar2 == uVar4) {
                dVar6 = dVar6 + A[uVar3] * B[uVar4];
              }
              uVar4 = uVar4 + 1;
            } while ((uint)lB != uVar4);
          }
          uVar3 = uVar3 + 1;
          uVar2 = uVar2 - 1;
        } while (uVar3 != (uint)lA);
      }
      C[uVar5] = dVar6;
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return uVar1;
}

Assistant:

int poly(double *A, double *B, double *C, int lA, int lB) {
	int lC,i,j,k;
	double temp;
	lC = lA + lB - 1;
	
	for(i = 0; i < lC;++i) {
			C[i] = 0.;
	}
	
	for(i = 0; i < lC;++i) {
		temp = 0.0;
		for(j = 0; j < lA;++j) {
			for(k = 0; k < lB;++k) {
				if (j + k == i) {
					temp += A[j] * B[k];
				}
			}
		}
		C[i] = temp;
			
	}
	
		
	return lC;
}